

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  Args args;
  
  Args::Args(&args,argc,argv);
  Args::run(&args);
  Args::~Args(&args);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
    try {
        auto args = Args(argc, argv);
        args.run();
        return 0;
    } catch (const std::runtime_error& err) {
        std::cerr << err.what() << std::endl;
        return -1;
    }
}